

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::If::makeEndIf(If *this)

{
  Builder *pBVar1;
  Block *elseBlock;
  
  createBranch(this->builder,true,this->mergeBlock);
  pBVar1 = this->builder;
  pBVar1->buildPoint = this->headerBlock;
  pBVar1->dirtyLineTracker = true;
  pBVar1->dirtyScopeTracker = true;
  elseBlock = this->elseBlock;
  if (elseBlock == (Block *)0x0) {
    elseBlock = this->mergeBlock;
  }
  createConditionalBranch(pBVar1,this->condition,this->thenBlock,elseBlock);
  spv::Function::addBlock(this->function,this->mergeBlock);
  pBVar1 = this->builder;
  pBVar1->buildPoint = this->mergeBlock;
  pBVar1->dirtyLineTracker = true;
  pBVar1->dirtyScopeTracker = true;
  return;
}

Assistant:

void Builder::If::makeEndIf()
{
    // jump to the merge block
    builder.createBranch(true, mergeBlock);

    // Go back to the headerBlock and make the flow control split
    builder.setBuildPoint(headerBlock);
    if (elseBlock)
        builder.createConditionalBranch(condition, thenBlock, elseBlock);
    else
        builder.createConditionalBranch(condition, thenBlock, mergeBlock);

    // add the merge block to the function
    function->addBlock(mergeBlock);
    builder.setBuildPoint(mergeBlock);
}